

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O1

bool __thiscall board::Board::sqAttacked(Board *this,int square,int side)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int i;
  long lVar5;
  int *piVar6;
  bool bVar7;
  
  if (((side == 0) &&
      ((this->board[(long)square + -0xb] == 1 || (this->board[(long)square + -9] == 1)))) ||
     ((side == 1 && ((this->board[(long)square + 0xb] == 7 || (this->board[(long)square + 9] == 7)))
      ))) {
    return true;
  }
  lVar5 = 0;
  uVar4 = side ^ 1;
  do {
    bVar7 = true;
    if (this->board[(long)MOVE_DIR[2][lVar5] + (long)square] == 2 && side == 0) {
      return true;
    }
    if (this->board[(long)MOVE_DIR[2][lVar5] + (long)square] == 8 && uVar4 == 0) {
      return true;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  lVar5 = 0;
  do {
    for (piVar6 = this->board + (MOVE_DIR[4][lVar5] + square); uVar1 = *piVar6, uVar1 == 0;
        piVar6 = piVar6 + MOVE_DIR[4][lVar5]) {
    }
    if (uVar1 != 99) {
      if ((side == 0) && ((uVar1 & 0xfffffffe) == 4)) {
        return true;
      }
      if ((side == 1) && ((uVar1 & 0xfffffffe) == 10)) {
        return true;
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  lVar5 = 0;
  do {
    for (piVar6 = this->board + (MOVE_DIR[3][lVar5] + square); uVar1 = *piVar6, uVar1 == 0;
        piVar6 = piVar6 + MOVE_DIR[3][lVar5]) {
    }
    if (uVar1 != 99) {
      if (side == 0) {
        if (uVar1 == 3) {
          return true;
        }
        if (uVar1 == 5) {
          return true;
        }
      }
      if ((side == 1) && ((uVar1 | 2) == 0xb)) {
        return true;
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  if ((this->board[(long)square + -9] != 6 || side != 0) &&
     (this->board[(long)square + -9] != 0xc || uVar4 != 0)) {
    uVar2 = 0;
    while (uVar3 = uVar2, uVar3 != 7) {
      if ((this->board[(long)MOVE_DIR[6][uVar3 + 1] + (long)square] == 6 && side == 0) ||
         (uVar2 = uVar3 + 1,
         this->board[(long)MOVE_DIR[6][uVar3 + 1] + (long)square] == 0xc && uVar4 == 0)) break;
    }
    bVar7 = uVar3 < 7;
  }
  return bVar7;
}

Assistant:

bool board::Board::sqAttacked(const int square, const int side) const
{
    int targetSquare;
    int piece;
    if (side == WHITE && (board[square - 11] == WP || board[square - 9] == WP)) {
        return true;
    }
    if (side == BLACK && (board[square + 11] == BP || board[square + 9] == BP)) {
        return true;
    }
    for (int i = 0; i < 8; i++) {
        piece = board[square + MOVE_DIR[WN][i]];
        if (side == WHITE && piece == WN) {
            return true;
        }
        if (side == BLACK && piece == BN) {
            return true;
        }
    }
    for (int i = 0; i < 4; i++) {
        targetSquare = square + MOVE_DIR[WR][i];
        piece = board[targetSquare];
        while (piece != NO_SQ) {
            if (piece != EMPTY) {
                if (side == WHITE && (board[targetSquare] == WR || board[targetSquare] == WQ)) {
                    return true;
                }
                if (side == BLACK && (board[targetSquare] == BR || board[targetSquare] == BQ)) {
                    return true;
                }
                break;
            }
            targetSquare += MOVE_DIR[WR][i];
            piece = board[targetSquare];
        }
    }
    for (int i = 0; i < 4; i++) {
        targetSquare = square + MOVE_DIR[WB][i];
        piece = board[targetSquare];
        while (piece != NO_SQ) {
            if (piece != EMPTY) {
                if (side == WHITE && (board[targetSquare] == WB || board[targetSquare] == WQ)) {
                    return true;
                }
                if (side == BLACK && (board[targetSquare] == BB || board[targetSquare] == BQ)) {
                    return true;
                }
                break;
            }
            targetSquare += MOVE_DIR[WB][i];
            piece = board[targetSquare];
        }
    }
    for (int i = 0; i < 8; i++) {
        piece = board[square + MOVE_DIR[WK][i]];
        if ((side == WHITE && piece == WK) || (side == BLACK && piece == BK)) {
            return true;
        }
    }
    return false;
}